

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_reopen_named_kvs(void)

{
  fdb_encryption_key *__s;
  short *psVar1;
  size_t *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  uint64_t extraout_RAX;
  uint64_t uVar10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar11;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar13;
  fdb_file_info *kvs_config_01;
  void *__s2;
  ulong uVar14;
  size_t sVar15;
  code *__s_00;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar16;
  char cVar17;
  uint uVar18;
  char *unaff_RBP;
  fdb_kvs_handle *pfVar19;
  char *pcVar20;
  fdb_file_info *info;
  fdb_file_handle *pfVar21;
  fdb_iterator *pfVar22;
  void *pvVar23;
  fdb_kvs_handle *pfVar24;
  undefined1 handle [8];
  void *unaff_R12;
  long lVar25;
  fdb_kvs_handle *pfVar26;
  size_t unaff_R13;
  __atomic_base<unsigned_long> _Var27;
  filemgr *ptr_fhandle;
  fdb_config *pfVar28;
  ulong uVar29;
  size_t sVar30;
  char *pcVar31;
  char *pcVar32;
  btree *pbVar33;
  fdb_doc **ppfVar34;
  timeval tVar35;
  timeval tVar36;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_17d48;
  undefined1 auStack_17d40 [16];
  undefined1 auStack_17d30 [8];
  undefined1 auStack_17d28 [80];
  ulong uStack_17cd8;
  timeval tStack_17cb8;
  fdb_file_info afStack_17ca8 [3];
  fdb_file_info afStack_17ba8 [3];
  fdb_config fStack_17aa8;
  filemgr *pfStack_179b0;
  fdb_kvs_handle *pfStack_179a8;
  fdb_kvs_handle *pfStack_179a0;
  fdb_config *pfStack_17998;
  fdb_kvs_handle *pfStack_17990;
  fdb_kvs_handle *pfStack_17988;
  fdb_file_handle *pfStack_17978;
  fdb_kvs_handle *pfStack_17970;
  timeval atStack_17968 [2];
  timeval tStack_17948;
  timeval tStack_17938;
  undefined1 auStack_17928 [70];
  undefined1 uStack_178e2;
  undefined8 uStack_178d8;
  filemgr *pfStack_17818;
  fdb_kvs_handle *pfStack_17810;
  fdb_kvs_handle *pfStack_17808;
  filemgr *pfStack_17800;
  fdb_kvs_handle *pfStack_177f8;
  fdb_kvs_handle *pfStack_177f0;
  undefined1 auStack_177e0 [8];
  undefined1 auStack_177d8 [8];
  undefined1 auStack_177d0 [8];
  undefined1 auStack_177c8 [16];
  undefined1 auStack_177b8 [16];
  fdb_kvs_config fStack_177a8;
  atomic<unsigned_long> aStack_17790;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17788;
  __atomic_base<unsigned_long> _Stack_17780;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17778;
  undefined1 auStack_17770 [8];
  undefined1 auStack_17768 [16];
  undefined1 auStack_17758 [16];
  atomic<unsigned_long> aStack_17748;
  fdb_open_flags fStack_17734;
  ushort uStack_1772a;
  filemgr *pfStack_17720;
  atomic<unsigned_long> aStack_176e0;
  undefined1 auStack_17660 [16];
  timeval tStack_17650;
  undefined1 auStack_17640 [328];
  char acStack_174f8 [256];
  char acStack_173f8 [256];
  fdb_kvs_handle afStack_172f8 [153];
  fdb_kvs_handle *pfStack_3a30;
  fdb_kvs_handle *pfStack_3a28;
  list *plStack_3a20;
  void *pvStack_3a18;
  fdb_kvs_config fStack_3a10;
  fdb_kvs_info fStack_39f8;
  timeval tStack_39c8;
  fdb_config fStack_39b8;
  char acStack_38c0 [256];
  fdb_kvs_handle afStack_37c0 [2];
  fdb_kvs_handle **ppfStack_3298;
  fdb_kvs_handle *pfStack_3290;
  fdb_kvs_handle *pfStack_3288;
  fdb_kvs_config *pfStack_3280;
  fdb_kvs_handle *pfStack_3278;
  fdb_kvs_handle *pfStack_3270;
  undefined1 auStack_3258 [16];
  undefined1 auStack_3248 [32];
  fdb_kvs_handle *pfStack_3228;
  fdb_kvs_config fStack_3220;
  fdb_kvs_info fStack_3208;
  timeval tStack_31d8;
  char acStack_31c8 [256];
  undefined1 auStack_30c8 [752];
  char acStack_2dd8 [256];
  fdb_kvs_handle fStack_2cd8;
  fdb_doc **ppfStack_2ad0;
  fdb_kvs_handle *pfStack_2ac8;
  undefined1 auStack_2ab0 [16];
  fdb_doc *pfStack_2aa0;
  fdb_kvs_handle *pfStack_2a98;
  fdb_doc *apfStack_2a90 [11];
  timeval tStack_2a38;
  undefined1 auStack_2a28 [536];
  char acStack_2810 [256];
  stat sStack_2710;
  fdb_config fStack_2680;
  fdb_kvs_handle **ppfStack_2588;
  fdb_kvs_handle *pfStack_2580;
  fdb_kvs_handle *pfStack_2578;
  fdb_kvs_handle *pfStack_2570;
  btree *pbStack_2568;
  fdb_kvs_handle *pfStack_2560;
  fdb_kvs_handle *pfStack_2550;
  fdb_kvs_handle *pfStack_2548;
  fdb_file_handle *pfStack_2540;
  fdb_kvs_handle *pfStack_2538;
  undefined1 auStack_2530 [32];
  undefined1 auStack_2510 [40];
  fdb_file_info fStack_24e8;
  fdb_config fStack_24a0;
  btree abStack_23a8 [4];
  char acStack_22a8 [256];
  char acStack_21a8 [264];
  code *pcStack_20a0;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  char *pcStack_2088;
  char *pcStack_2080;
  fdb_kvs_handle *pfStack_2078;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2060;
  fdb_file_handle *pfStack_2058;
  fdb_kvs_handle *pfStack_2050;
  int iStack_2044;
  undefined1 auStack_2040 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2000;
  fdb_kvs_config fStack_1fd8;
  timeval tStack_1fc0;
  char acStack_1fb0 [256];
  fdb_doc *apfStack_1eb0 [20];
  undefined1 auStack_1e10 [520];
  undefined8 uStack_1c08;
  undefined8 uStack_1c00;
  undefined4 uStack_1bec;
  undefined1 uStack_1be1;
  undefined1 uStack_1bd0;
  undefined8 uStack_1b58;
  size_t sStack_1b18;
  size_t sStack_1b10;
  fdb_doc **ppfStack_1b08;
  char *pcStack_1b00;
  code *pcStack_1af8;
  code *pcStack_1af0;
  fdb_file_handle *pfStack_1ad8;
  fdb_snapshot_info_t *pfStack_1ad0;
  uint64_t uStack_1ac8;
  uint uStack_1abc;
  fdb_kvs_handle *apfStack_1ab8 [4];
  fdb_kvs_config fStack_1a98;
  char acStack_1a80 [8];
  timeval tStack_1a78;
  char acStack_1a68 [256];
  char acStack_1968 [256];
  char acStack_1868 [264];
  fdb_config fStack_1760;
  fdb_doc *apfStack_1668 [301];
  fdb_kvs_handle **ppfStack_d00;
  void *pvStack_cf8;
  size_t sStack_cf0;
  fdb_kvs_handle *pfStack_ce8;
  btree *pbStack_ce0;
  code *pcStack_cd8;
  fdb_kvs_handle *pfStack_cc0;
  fdb_iterator *pfStack_cb8;
  fdb_kvs_handle *pfStack_cb0;
  undefined1 auStack_ca8 [16];
  undefined1 auStack_c98 [40];
  btree bStack_c70;
  fdb_kvs_info fStack_c28;
  fdb_config fStack_bf8;
  char acStack_b00 [256];
  char acStack_a00 [256];
  char acStack_900 [264];
  fdb_kvs_handle **ppfStack_7f8;
  fdb_kvs_handle *local_7c0;
  fdb_file_handle *local_7b8;
  fdb_kvs_config local_7b0;
  timeval local_798;
  fdb_kvs_info local_788;
  char local_758 [264];
  fdb_config local_650;
  char local_558 [256];
  char local_458 [256];
  fdb_doc *apfStack_358 [101];
  
  gettimeofday(&local_798,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_650.wal_threshold = 0x400;
  local_650.flags = 1;
  local_650.compaction_threshold = '\0';
  fdb_open(&local_7b8,"./compact_test1",&local_650);
  fdb_kvs_open(local_7b8,&local_7c0,"db",&local_7b0);
  fVar3 = fdb_set_log_callback(local_7c0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar25 = 0;
    uVar14 = 0;
    do {
      sprintf(local_458,"key%d",uVar14 & 0xffffffff);
      sprintf(local_558,"meta%d",uVar14 & 0xffffffff);
      sprintf(local_758,"body%d",uVar14 & 0xffffffff);
      sVar5 = strlen(local_458);
      sVar6 = strlen(local_558);
      sVar7 = strlen(local_758);
      fdb_doc_create((fdb_doc **)((long)apfStack_358 + lVar25),local_458,sVar5,local_558,sVar6,
                     local_758,sVar7);
      fdb_set(local_7c0,apfStack_358[uVar14]);
      uVar14 = uVar14 + 1;
      lVar25 = lVar25 + 8;
    } while (uVar14 != 100);
    fdb_commit(local_7b8,'\0');
    fdb_compact(local_7b8,(char *)0x0);
    fdb_get_kvs_info(local_7c0,&local_788);
    lVar25 = (long)(int)local_788.doc_count;
    fdb_kvs_close(local_7c0);
    fdb_close(local_7b8);
    fdb_open(&local_7b8,"./compact_test1",&local_650);
    fdb_kvs_open(local_7b8,&local_7c0,"db",&local_7b0);
    fdb_get_kvs_info(local_7c0,&local_788);
    if (lVar25 != CONCAT44(local_788.doc_count._4_4_,(int)local_788.doc_count)) {
      compact_reopen_named_kvs();
    }
    fdb_kvs_close(local_7c0);
    fdb_close(local_7b8);
    lVar25 = 0;
    do {
      fdb_doc_free(apfStack_358[lVar25]);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 100);
    fdb_shutdown();
    memleak_end();
    pcVar20 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar20 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar20,"compact reopen named kvs");
    return;
  }
  compact_reopen_named_kvs();
  pcStack_cd8 = (code *)0x10d8fa;
  ppfStack_7f8 = &local_7c0;
  gettimeofday((timeval *)(auStack_c98 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_cd8 = (code *)0x10d8ff;
  memleak_start();
  pfStack_cb0 = (fdb_kvs_handle *)0x0;
  pcStack_cd8 = (code *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_cd8 = (code *)0x10d924;
  fdb_get_default_config();
  pfVar8 = (fdb_kvs_handle *)auStack_c98;
  pcStack_cd8 = (code *)0x10d931;
  fdb_get_default_kvs_config();
  fStack_bf8.wal_threshold = 0x400;
  fStack_bf8.flags = 1;
  fStack_bf8.compaction_threshold = '\0';
  pbVar33 = (btree *)auStack_ca8;
  pcStack_cd8 = (code *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",&fStack_bf8);
  ppfVar16 = &pfStack_cc0;
  pcStack_cd8 = (code *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)auStack_ca8._0_8_,ppfVar16,"db",(fdb_kvs_config *)pfVar8);
  pcStack_cd8 = (code *)0x10d98b;
  pfVar26 = pfStack_cc0;
  fVar3 = fdb_set_log_callback(pfStack_cc0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar18 = (uint)pfVar26;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (void *)0x0;
    uVar14 = 0;
    do {
      pcStack_cd8 = (code *)0x10d9b3;
      sprintf(acStack_900,"key%d",uVar14 & 0xffffffff);
      pcStack_cd8 = (code *)0x10d9cb;
      sprintf(acStack_a00,"meta%d",uVar14 & 0xffffffff);
      pcStack_cd8 = (code *)0x10d9e3;
      sprintf(acStack_b00,"body%d",uVar14 & 0xffffffff);
      pbVar33 = (btree *)(&bStack_c70.ksize + (long)unaff_R12);
      pcStack_cd8 = (code *)0x10d9f3;
      unaff_R13 = strlen(acStack_900);
      unaff_RBP = acStack_a00;
      pcStack_cd8 = (code *)0x10da06;
      pfVar8 = (fdb_kvs_handle *)strlen(unaff_RBP);
      pcStack_cd8 = (code *)0x10da16;
      sVar5 = strlen(acStack_b00);
      pcStack_cd8 = (code *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar33,acStack_900,unaff_R13,unaff_RBP,(size_t)pfVar8,acStack_b00,
                     sVar5);
      pcStack_cd8 = (code *)0x10da4a;
      fdb_set(pfStack_cc0,*(fdb_doc **)(&bStack_c70.ksize + uVar14 * 8));
      uVar14 = uVar14 + 1;
      unaff_R12 = (void *)((long)unaff_R12 + 8);
    } while (uVar14 != 9);
    pcStack_cd8 = (code *)0x10da67;
    fdb_commit((fdb_file_handle *)auStack_ca8._0_8_,'\0');
    ppfVar16 = (fdb_kvs_handle **)(auStack_ca8 + 8);
    pcStack_cd8 = (code *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar16,"./compact_test1",&fStack_bf8);
    pcStack_cd8 = (code *)0x10da92;
    pfVar21 = (fdb_file_handle *)auStack_ca8._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_ca8._8_8_,"./compact_test2");
    uVar18 = (uint)pfVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pcStack_cd8 = (code *)0x10daa4;
    fdb_close((fdb_file_handle *)auStack_ca8._8_8_);
    pcStack_cd8 = (code *)0x10dac4;
    pfVar26 = pfStack_cc0;
    fVar3 = fdb_iterator_init(pfStack_cc0,&pfStack_cb8,(void *)0x0,0,(void *)0x0,0,0);
    uVar18 = (uint)pfVar26;
    pfVar26 = pfVar8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    unaff_R13 = 0;
    ppfVar16 = &pfStack_cb0;
    do {
      pcStack_cd8 = (code *)0x10dae1;
      fVar3 = fdb_iterator_get(pfStack_cb8,(fdb_doc **)ppfVar16);
      pfVar26 = pfStack_cb0;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pcStack_cd8 = (code *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pcStack_cd8 = (code *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pcStack_cd8 = (code *)0x10dcb0;
        pvVar23 = unaff_R12;
        compact_reopen_with_iterator();
        uVar18 = (uint)pvVar23;
        goto LAB_0010dcb0;
      }
      pbVar33 = (btree *)pfStack_cb0->op_stats;
      unaff_RBP = *(char **)(&bStack_c70.ksize + unaff_R13 * 8);
      unaff_R12 = *(void **)(unaff_RBP + 0x20);
      pcStack_cd8 = (code *)0x10db09;
      iVar4 = bcmp(pbVar33,unaff_R12,*(size_t *)&pfStack_cb0->kvs_config);
      pfVar8 = pfVar26;
      if (iVar4 != 0) {
        pcStack_cd8 = (code *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar33 = pfVar26->staletree;
      unaff_R12 = *(void **)(unaff_RBP + 0x38);
      pcStack_cd8 = (code *)0x10db28;
      iVar4 = bcmp(pbVar33,unaff_R12,(size_t)(pfVar26->kvs_config).custom_cmp);
      if (iVar4 != 0) goto LAB_0010dca5;
      pbVar33 = (pfVar26->field_6).seqtree;
      unaff_R12 = *(void **)(unaff_RBP + 0x40);
      pcStack_cd8 = (code *)0x10db47;
      iVar4 = bcmp(pbVar33,unaff_R12,(size_t)(pfVar26->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_0010dc9a;
      pcStack_cd8 = (code *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar26);
      pfStack_cb0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pcStack_cd8 = (code *)0x10db6d;
      pfVar22 = pfStack_cb8;
      fVar3 = fdb_iterator_next(pfStack_cb8);
      uVar18 = (uint)pfVar22;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dcbf;
    pcStack_cd8 = (code *)0x10db8a;
    fVar3 = fdb_iterator_close(pfStack_cb8);
    uVar18 = (uint)pfStack_cb8;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pcStack_cd8 = (code *)0x10dbaa;
      fdb_get_kvs_info(pfStack_cc0,&fStack_c28);
      lVar25 = (long)(int)fStack_c28.doc_count;
      pcStack_cd8 = (code *)0x10dbb6;
      fdb_kvs_close(pfStack_cc0);
      pcStack_cd8 = (code *)0x10dbc4;
      fdb_close((fdb_file_handle *)auStack_ca8._0_8_);
      pcStack_cd8 = (code *)0x10dbdb;
      fdb_open((fdb_file_handle **)auStack_ca8,"./compact_test2",&fStack_bf8);
      pcStack_cd8 = (code *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)auStack_ca8._0_8_,&pfStack_cc0,"db",
                   (fdb_kvs_config *)auStack_c98);
      pcStack_cd8 = (code *)0x10dbfe;
      fdb_get_kvs_info(pfStack_cc0,&fStack_c28);
      if (lVar25 != CONCAT44(fStack_c28.doc_count._4_4_,(int)fStack_c28.doc_count)) {
        pcStack_cd8 = (code *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pcStack_cd8 = (code *)0x10dc1e;
      fdb_kvs_close(pfStack_cc0);
      pcStack_cd8 = (code *)0x10dc28;
      fdb_close((fdb_file_handle *)auStack_ca8._0_8_);
      lVar25 = 0;
      do {
        pcStack_cd8 = (code *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_c70.ksize + lVar25 * 8));
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
      pcStack_cd8 = (code *)0x10dc42;
      fdb_shutdown();
      pcStack_cd8 = (code *)0x10dc47;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_cd8 = (code *)0x10dc78;
      fprintf(_stderr,pcVar20,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dcb0:
    pcStack_cd8 = (code *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pcStack_cd8 = (code *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar26 = pfVar8;
LAB_0010dcba:
    pcStack_cd8 = (code *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pcStack_cd8 = (code *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pcStack_cd8 = estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_1af0 = (code *)0x10dceb;
  ppfStack_d00 = ppfVar16;
  pvStack_cf8 = unaff_R12;
  sStack_cf0 = unaff_R13;
  pfStack_ce8 = pfVar26;
  pbStack_ce0 = pbVar33;
  pcStack_cd8 = (code *)unaff_RBP;
  gettimeofday(&tStack_1a78,(__timezone_ptr_t)0x0);
  pcStack_1af0 = (code *)0x10dcf0;
  memleak_start();
  pcStack_1af0 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_1af0 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_1760.buffercache_size = 0;
  fStack_1760.wal_threshold = 0x32;
  fStack_1760.flags = 1;
  fStack_1760.compaction_threshold = '\0';
  fStack_1760.block_reusing_threshold = 0;
  pcStack_1af0 = (code *)0x10dd38;
  fStack_1760.multi_kv_instances = (bool)(char)uVar18;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_1af0 = (code *)0x10dd4c;
  fdb_open(&pfStack_1ad8,"./compact_test1",&fStack_1760);
  uStack_1abc = uVar18;
  if (uVar18 == 0) {
    pcStack_1af0 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_1ad8,apfStack_1ab8,&fStack_1a98);
    sVar15 = 1;
  }
  else {
    ppfVar16 = apfStack_1ab8;
    uVar14 = 0;
    do {
      pcStack_1af0 = (code *)0x10dd7d;
      sprintf(acStack_1a80,"kv%d",uVar14 & 0xffffffff);
      pcStack_1af0 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_1ad8,ppfVar16,acStack_1a80,&fStack_1a98);
      uVar14 = uVar14 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar14 != 4);
    sVar15 = 4;
  }
  uVar14 = 0;
  do {
    pcStack_1af0 = (code *)0x10dddc;
    sprintf(acStack_1868,"key%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10ddf5;
    sprintf(acStack_1968,"meta%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10de0e;
    sprintf(acStack_1a68,"body%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10de21;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10de34;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10de44;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10de69;
    fdb_doc_create(apfStack_1668 + uVar14,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10de7a;
      fdb_set(apfStack_1ab8[sVar30],apfStack_1668[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x4b);
  pcStack_1af0 = (code *)0x10de9e;
  fdb_commit(pfStack_1ad8,'\x01');
  uVar14 = 0x4b;
  do {
    pcStack_1af0 = (code *)0x10dec0;
    sprintf(acStack_1868,"key%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10ded9;
    sprintf(acStack_1968,"meta%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10def2;
    sprintf(acStack_1a68,"body%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10df05;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10df18;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10df28;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10df4d;
    fdb_doc_create(apfStack_1668 + uVar14,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10df5e;
      fdb_set(apfStack_1ab8[sVar30],apfStack_1668[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x96);
  lVar25 = 0;
  do {
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10df8e;
      fdb_set(apfStack_1ab8[sVar30],apfStack_1668[lVar25]);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x4b);
  lVar25 = 0;
  do {
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10dfb7;
      fdb_set(apfStack_1ab8[sVar30],apfStack_1668[lVar25]);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x4b);
  pcStack_1af0 = (code *)0x10dfd4;
  fdb_commit(pfStack_1ad8,'\0');
  uVar14 = 0x96;
  do {
    pcStack_1af0 = (code *)0x10dff6;
    sprintf(acStack_1868,"key%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e00f;
    sprintf(acStack_1968,"meta%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e028;
    sprintf(acStack_1a68,"body%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e03b;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10e04e;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10e05e;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10e083;
    fdb_doc_create(apfStack_1668 + uVar14,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10e094;
      fdb_set(apfStack_1ab8[sVar30],apfStack_1668[uVar14]);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0xe1);
  pcStack_1af0 = (code *)0x10e0bb;
  fdb_commit(pfStack_1ad8,'\x01');
  uVar14 = 0xe1;
  do {
    pcStack_1af0 = (code *)0x10e0dd;
    sprintf(acStack_1868,"key%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e0f6;
    sprintf(acStack_1968,"meta%d",uVar14 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e10f;
    sprintf(acStack_1a68,"body%d",uVar14 & 0xffffffff);
    ppfVar34 = apfStack_1668 + uVar14;
    pcStack_1af0 = (code *)0x10e122;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10e135;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10e145;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10e16a;
    fdb_doc_create(ppfVar34,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar30 = 0;
    do {
      pcStack_1af0 = (code *)0x10e17b;
      fdb_set(apfStack_1ab8[sVar30],*ppfVar34);
      sVar30 = sVar30 + 1;
    } while (sVar15 != sVar30);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 300);
  sVar30 = 0;
  pcStack_1af0 = (code *)0x10e1a2;
  fdb_commit(pfStack_1ad8,'\0');
  do {
    pfVar8 = apfStack_1ab8[sVar30];
    pcStack_1af0 = (code *)0x10e1c0;
    fVar3 = fdb_set_log_callback(pfVar8,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_1af0 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar30 = sVar30 + 1;
  } while (sVar15 != sVar30);
  pcStack_1af0 = (code *)0x10e1e4;
  pfVar21 = pfStack_1ad8;
  fVar3 = fdb_get_all_snap_markers(pfStack_1ad8,&pfStack_1ad0,&uStack_1ac8);
  iVar4 = (int)pfVar21;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar5 = (size_t)uStack_1abc;
    cVar17 = (char)uStack_1abc;
    uVar10 = uStack_1ac8;
    if (cVar17 != '\0') {
      if (uStack_1ac8 != 8) {
        pcStack_1af0 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_1af0 = (code *)0x10e21d;
      sVar15 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[1].marker);
      pcStack_1af0 = (code *)0x10e233;
      sVar9 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[2].marker);
      if (sVar9 <= sVar15) {
        pcStack_1af0 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar10 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_1af0 = (code *)0x10e28e;
      fVar3 = fdb_free_snap_markers(pfStack_1ad0,uStack_1ac8);
      iVar4 = (int)pfStack_1ad0;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_1af0 = (code *)0x10e2a0;
        fdb_close(pfStack_1ad8);
        lVar25 = 0;
        do {
          pcStack_1af0 = (code *)0x10e2af;
          fdb_doc_free(apfStack_1668[lVar25]);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 300);
        pcStack_1af0 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_1af0 = (code *)0x10e2c5;
        memleak_end();
        pcVar20 = "single kv mode:";
        if (cVar17 != '\0') {
          pcVar20 = "multiple kv mode:";
        }
        pcStack_1af0 = (code *)0x10e2f3;
        sprintf(acStack_1a68,"estimate space upto marker in file test %s",pcVar20);
        pcVar20 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pcStack_1af0 = (code *)0x10e320;
        fprintf(_stderr,pcVar20,acStack_1a68);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar10 != 4) {
      pcStack_1af0 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_1af0 = (code *)0x10e260;
    sVar15 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[1].marker);
    pcStack_1af0 = (code *)0x10e276;
    pfVar21 = pfStack_1ad8;
    sVar9 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[2].marker);
    iVar4 = (int)pfVar21;
    if (sVar15 < sVar9) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_1af0 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_1af0 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_1af0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_1af8 = logCallbackFunc;
  pcStack_1b00 = "estimate_space_upto_test";
  pfStack_2078 = (fdb_kvs_handle *)0x10e36b;
  sStack_1b18 = sVar15;
  sStack_1b10 = sVar30;
  ppfStack_1b08 = ppfVar34;
  pcStack_1af0 = (code *)sVar5;
  gettimeofday(&tStack_1fc0,(__timezone_ptr_t)0x0);
  pfStack_2078 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_2078 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_2078 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_1c08 = 0;
  uStack_1c00 = 0x400;
  uStack_1bec = 1;
  uStack_1be1 = 0;
  uStack_1b58 = 0;
  pfStack_2078 = (fdb_kvs_handle *)0x10e3bb;
  uStack_1bd0 = (char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2078 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_2058,"./compact_test1",(fdb_config *)(auStack_1e10 + 0x200));
  iStack_2044 = iVar4;
  if (iVar4 == 0) {
    pfStack_2078 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_2058,(fdb_kvs_handle **)(auStack_2040 + 0x20),&fStack_1fd8);
    uVar18 = 1;
  }
  else {
    ppfVar16 = (fdb_kvs_handle **)(auStack_2040 + 0x20);
    uVar14 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_2040,"kv%d",uVar14 & 0xffffffff);
      pfStack_2078 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_2058,ppfVar16,auStack_2040,&fStack_1fd8);
      uVar14 = uVar14 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar14 != 4);
    uVar18 = 4;
  }
  pcVar20 = (char *)(ulong)uVar18;
  uVar14 = 0;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_1e10 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_1e10,"meta%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_1fb0,"body%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e4a9;
    sVar5 = strlen(auStack_1e10 + 0x100);
    pfStack_2078 = (fdb_kvs_handle *)0x10e4bc;
    sVar6 = strlen(auStack_1e10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e4cc;
    sVar7 = strlen(acStack_1fb0);
    pfStack_2078 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_1eb0 + uVar14,auStack_1e10 + 0x100,sVar5,auStack_1e10,sVar6,acStack_1fb0
                   ,sVar7);
    lVar25 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar25 * 8 + 0x20),apfStack_1eb0[uVar14]);
      lVar25 = lVar25 + 1;
    } while (pcVar20 != (char *)lVar25);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 5);
  pfStack_2078 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_2058,'\x01');
  uVar14 = 5;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_1e10 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_1e10,"meta%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_1fb0,"body%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e588;
    sVar5 = strlen(auStack_1e10 + 0x100);
    pfStack_2078 = (fdb_kvs_handle *)0x10e59b;
    sVar6 = strlen(auStack_1e10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e5ab;
    sVar7 = strlen(acStack_1fb0);
    pfStack_2078 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_1eb0 + uVar14,auStack_1e10 + 0x100,sVar5,auStack_1e10,sVar6,acStack_1fb0
                   ,sVar7);
    lVar25 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar25 * 8 + 0x20),apfStack_1eb0[uVar14]);
      lVar25 = lVar25 + 1;
    } while (pcVar20 != (char *)lVar25);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  pfStack_2078 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_2058,'\0');
  uVar14 = 10;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_1e10 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_1e10,"meta%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_1fb0,"body%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e665;
    sVar5 = strlen(auStack_1e10 + 0x100);
    pfStack_2078 = (fdb_kvs_handle *)0x10e678;
    sVar6 = strlen(auStack_1e10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e688;
    sVar7 = strlen(acStack_1fb0);
    pfStack_2078 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_1eb0 + uVar14,auStack_1e10 + 0x100,sVar5,auStack_1e10,sVar6,acStack_1fb0
                   ,sVar7);
    lVar25 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar25 * 8 + 0x20),apfStack_1eb0[uVar14]);
      lVar25 = lVar25 + 1;
    } while (pcVar20 != (char *)lVar25);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0xf);
  pfStack_2078 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_2058,'\x01');
  uVar14 = 0xf;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_1e10 + 0x100,"key%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_1e10,"meta%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_1fb0,"body%d",uVar14 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e745;
    pfVar8 = (fdb_kvs_handle *)strlen(auStack_1e10 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_1e10;
    pfStack_2078 = (fdb_kvs_handle *)0x10e758;
    sVar5 = strlen((char *)doc._M_i);
    pfStack_2078 = (fdb_kvs_handle *)0x10e768;
    sVar6 = strlen(acStack_1fb0);
    pfStack_2078 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_1eb0 + uVar14,auStack_1e10 + 0x100,(size_t)pfVar8,(void *)doc._M_i,sVar5
                   ,acStack_1fb0,sVar6);
    lVar25 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar25 * 8 + 0x20),apfStack_1eb0[uVar14]);
      lVar25 = lVar25 + 1;
    } while (pcVar20 != (char *)lVar25);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x14);
  pfVar26 = (fdb_kvs_handle *)0x0;
  pfStack_2078 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_2058,'\0');
  __s_00 = logCallbackFunc;
  pcVar31 = "compact_upto_test";
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e7e0;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2040 + (long)pfVar26 * 8 + 0x20),logCallbackFunc
                       ,"compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar20 != pfVar26);
  pfStack_2078 = (fdb_kvs_handle *)0x10e804;
  fVar3 = fdb_get_all_snap_markers
                    (pfStack_2058,(fdb_snapshot_info_t **)&aStack_2060.seqtree,
                     (uint64_t *)&pfStack_2050);
  pcVar32 = pcVar31;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2f;
  if ((char)iStack_2044 == '\0') {
    if (pfStack_2050 != (fdb_kvs_handle *)0x4) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e92b;
      compact_upto_test();
    }
    pfVar26 = (fdb_kvs_handle *)0x1400000000;
    doc._M_i = 0;
    pfVar8 = (fdb_kvs_handle *)0xfffffffb00000000;
    pcVar20 = auStack_2040 + 0x40;
    pcVar32 = (char *)0x0;
    aVar11 = aStack_2060;
    do {
      if (*(long *)((long)&(aVar11.seqtree)->root_bid + doc._M_i) != 1) {
        pfStack_2078 = (fdb_kvs_handle *)0x10e98d;
        compact_upto_test();
        aVar11 = aStack_2000;
      }
      if (*(long *)(*(long *)((long)&(aVar11.seqtree)->blk_handle + doc._M_i) + 8) !=
          (long)pfVar26 >> 0x20) {
        pfStack_2078 = (fdb_kvs_handle *)0x10e9a2;
        compact_upto_test();
        aVar11 = aStack_2000;
      }
      pcVar32 = (char *)((long)pcVar32 + 1);
      pfVar26 = (fdb_kvs_handle *)(pfVar26[-0x2762763].config.encryption_key.bytes + 0x14);
      doc._M_i = doc._M_i + 0x18;
    } while (pcVar32 < pfStack_2050);
    __s_00 = (code *)(auStack_2040 + 0x40);
    pfStack_2078 = (fdb_kvs_handle *)0x10e9c4;
    sprintf((char *)__s_00,"compact_test_compact%d",1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e9da;
    fVar3 = fdb_compact_upto(pfStack_2058,(char *)__s_00,
                             (fdb_snapshot_marker_t)(aStack_2060.seqtree)->blk_ops);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e9fe;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2040._32_8_,
                                (fdb_kvs_handle **)(auStack_2040 + 0x18),
                                (fdb_seqnum_t)(aStack_2060.seqtrie)->btree_blk_ops->blk_alloc_sub);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2078 = (fdb_kvs_handle *)0x10ea07;
        compact_upto_test();
        goto LAB_0010ea07;
      }
LAB_0010ea64:
      __s_00 = (code *)(auStack_2040 + 0x40);
      pfStack_2078 = (fdb_kvs_handle *)0x10ea6e;
      fdb_kvs_close((fdb_kvs_handle *)auStack_2040._24_8_);
      pfStack_2078 = (fdb_kvs_handle *)0x10ea7d;
      fVar3 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStack_2060.seqtree,(uint64_t)pfStack_2050);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_2078 = (fdb_kvs_handle *)0x10ea8f;
        fdb_close(pfStack_2058);
        lVar25 = 0;
        do {
          pfStack_2078 = (fdb_kvs_handle *)0x10ea9e;
          fdb_doc_free(apfStack_1eb0[lVar25]);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0x14);
        pfStack_2078 = (fdb_kvs_handle *)0x10eaac;
        fdb_shutdown();
        pfStack_2078 = (fdb_kvs_handle *)0x10eab1;
        memleak_end();
        pcVar20 = "single kv mode:";
        if ((char)iStack_2044 != '\0') {
          pcVar20 = "multiple kv mode:";
        }
        pfStack_2078 = (fdb_kvs_handle *)0x10eae1;
        sprintf(acStack_1fb0,"compact upto marker in file test %s",pcVar20);
        pcVar20 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_2078 = (fdb_kvs_handle *)0x10eb0e;
        fprintf(_stderr,pcVar20,acStack_1fb0);
        return;
      }
      goto LAB_0010eb34;
    }
    goto LAB_0010eb39;
  }
  if (pfStack_2050 != (fdb_kvs_handle *)0x8) {
    pfStack_2078 = (fdb_kvs_handle *)0x10e82c;
    compact_upto_test();
  }
  auStack_2040._8_8_ = ZEXT48(uVar18 + 1);
  doc._M_i = (__int_type_conflict)auStack_2040;
  pcVar32 = (char *)0x0;
  do {
    __s_00 = (code *)((long)pcVar32 * 3);
    aVar11 = aStack_2060;
    if ((fdb_custom_cmp_variable)(&(aStack_2060.seqtree)->root_bid)[(long)pcVar32 * 3] !=
        (fdb_custom_cmp_variable)auStack_2040._8_8_) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e911;
      compact_upto_test();
      aVar11 = aStack_2000;
    }
    pfVar8 = (fdb_kvs_handle *)((long)pcVar32 * -5 + 0x14);
    pfVar13 = (fdb_kvs_commit_marker_t *)(&(aVar11.seqtree)->blk_handle)[(long)pcVar32 * 3];
    pfVar26 = (fdb_kvs_handle *)0x8;
    pcVar31 = (char *)0x0;
    auStack_2040._16_8_ = pcVar32;
    do {
      if (*(fdb_kvs_handle **)(&(pfVar26->kvs_config).create_if_missing + (long)pfVar13) != pfVar8)
      {
        pfStack_2078 = (fdb_kvs_handle *)0x10e8e2;
        compact_upto_test();
      }
      pfStack_2078 = (fdb_kvs_handle *)0x10e892;
      sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar31 & 0xffffffff);
      pfVar13 = (fdb_kvs_commit_marker_t *)(&(aStack_2060.seqtree)->blk_handle)[(long)pcVar32 * 3];
      psVar1 = *(short **)((long)&pfVar13[-1].seqnum + (long)pfVar26);
      if ((char)psVar1[1] != auStack_2040[2] || *psVar1 != auStack_2040._0_2_) {
        pfStack_2078 = (fdb_kvs_handle *)0x10eb2a;
        compact_upto_test();
        goto LAB_0010eb2a;
      }
      pcVar31 = pcVar31 + 1;
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).custom_cmp_param;
    } while (pcVar20 != pcVar31);
    pcVar32 = (char *)(auStack_2040._16_8_ + 1);
  } while (pcVar32 != pcVar20);
LAB_0010ea07:
  __s_00 = (code *)(auStack_2040 + 0x40);
  pfStack_2078 = (fdb_kvs_handle *)0x10ea22;
  sprintf((char *)__s_00,"compact_test_compact%d",1);
  pfStack_2078 = (fdb_kvs_handle *)0x10ea38;
  fVar3 = fdb_compact_upto(pfStack_2058,(char *)__s_00,
                           (fdb_snapshot_marker_t)(aStack_2060.seqtree)->blk_ops);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
  pfStack_2078 = (fdb_kvs_handle *)0x10ea5c;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2040._40_8_,
                            (fdb_kvs_handle **)(auStack_2040 + 0x18),
                            (fdb_seqnum_t)(aStack_2060.seqtrie)->btree_blk_ops->blk_read);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
LAB_0010eb43:
  pfStack_2078 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_2560 = (fdb_kvs_handle *)0x10eb65;
  pcStack_20a0 = __s_00;
  pfStack_2098 = pfVar26;
  pfStack_2090 = (fdb_kvs_handle *)doc._M_i;
  pcStack_2088 = pcVar20;
  pcStack_2080 = pcVar32;
  pfStack_2078 = pfVar8;
  gettimeofday((timeval *)(auStack_2510 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_2560 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_2560 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2560 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_2510;
  pfStack_2560 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_24a0.buffercache_size = 0x1000000;
  fStack_24a0.wal_threshold = 0x400;
  fStack_24a0.flags = 1;
  fStack_24a0.compaction_threshold = '\0';
  pbVar33 = (btree *)&pfStack_2540;
  pfStack_2560 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar33,"./compact_test1",&fStack_24a0);
  ppfVar16 = &pfStack_2550;
  pfStack_2560 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_2540,ppfVar16,(fdb_kvs_config *)pfVar12);
  pfStack_2560 = (fdb_kvs_handle *)0x10ebee;
  fVar3 = fdb_set_log_callback(pfStack_2550,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_2560 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_2530,"./compact_test1",&fStack_24a0);
    ppfVar16 = &pfStack_2538;
    pfStack_2560 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2530._0_8_,ppfVar16,(fdb_kvs_config *)auStack_2510);
    pfStack_2560 = (fdb_kvs_handle *)0x10ec3d;
    fVar3 = fdb_set_log_callback(pfStack_2538,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_2560 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_21a8,"key%d",0);
    pfStack_2560 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_22a8,"meta%d",0);
    pbVar33 = abStack_23a8;
    pfStack_2560 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar33,"body%d",0);
    pfStack_2560 = (fdb_kvs_handle *)0x10ec9e;
    sVar5 = strlen(acStack_21a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10eca9;
    sVar6 = strlen(acStack_22a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10ecb4;
    sVar7 = strlen((char *)pbVar33);
    pfStack_2560 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_2530 + 8),acStack_21a8,sVar5,acStack_22a8,sVar6,pbVar33,
                   sVar7);
    pfStack_2560 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_2550,(fdb_doc *)auStack_2530._8_8_);
    pfStack_2560 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_21a8,"key%d",1);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_22a8,"meta%d",1);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar33,"body%d",1);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed2c;
    sVar5 = strlen(acStack_21a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed37;
    sVar6 = strlen(acStack_22a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed42;
    sVar7 = strlen((char *)pbVar33);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_2530 + 0x10),acStack_21a8,sVar5,acStack_22a8,sVar6,pbVar33,
                   sVar7);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_2550,(fdb_doc *)auStack_2530._16_8_);
    pfStack_2560 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_2548,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_2530._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_2530._16_8_,
                   *(btree_print_func **)(auStack_2530._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_2530._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_2548->file = true;
    pfStack_2560 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_2550,(fdb_doc *)pfStack_2548);
    pfStack_2560 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_2548);
    pfStack_2560 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_2540,'\x01');
    pfStack_2560 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_2540,"./compact_test2");
    pfStack_2560 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_2560 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_21a8,"key%d",2);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_22a8,"meta%d",2);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar33,"body%d",2);
    pfVar26 = (fdb_kvs_handle *)(auStack_2530 + 0x18);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_21a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee3b;
    pfVar8 = (fdb_kvs_handle *)strlen(acStack_22a8);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee46;
    sVar5 = strlen((char *)pbVar33);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar26,acStack_21a8,doc._M_i,acStack_22a8,(size_t)pfVar8,pbVar33,
                   sVar5);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_2550,(fdb_doc *)auStack_2530._24_8_);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_2540,'\x01');
    pfStack_2560 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_2550);
    ppfVar16 = &pfStack_2538;
    pfStack_2560 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_2538);
    pfStack_2560 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_2540);
    pfVar12 = (fdb_kvs_handle *)auStack_2530;
    pfStack_2560 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_2530._0_8_);
    pfStack_2560 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_2560 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",&fStack_24a0);
    pfStack_2560 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2530._0_8_,ppfVar16,(fdb_kvs_config *)auStack_2510);
    pfStack_2560 = (fdb_kvs_handle *)0x10eef5;
    fVar3 = fdb_set_log_callback(pfStack_2538,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar16 = &pfStack_2548;
      while( true ) {
        pfStack_2560 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar16,
                       (void *)(*(size_t **)(auStack_2530 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_2530 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_2560 = (fdb_kvs_handle *)0x10ef38;
        fVar3 = fdb_get(pfStack_2538,(fdb_doc *)pfStack_2548);
        pfVar24 = pfStack_2548;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_2560 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar24);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar12 = pfVar24;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_2560 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_2530._0_8_,&fStack_24e8);
          pfStack_2560 = (fdb_kvs_handle *)0x10efd4;
          iVar4 = strcmp("./compact_test2",fStack_24e8.filename);
          if (iVar4 != 0) {
            pfStack_2560 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_2560 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_2538);
          pfStack_2560 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_2530._0_8_);
          lVar25 = 0;
          do {
            pfStack_2560 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_2530 + lVar25 * 8 + 8));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 3);
          pfStack_2560 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_2560 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_2560 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar20,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pbVar33 = pfStack_2548->staletree;
        pfVar8 = *(fdb_kvs_handle **)(auStack_2530 + doc._M_i * 8 + 8);
        pfVar26 = (fdb_kvs_handle *)pfVar8->staletree;
        pfStack_2560 = (fdb_kvs_handle *)0x10ef77;
        iVar4 = bcmp(pbVar33,pfVar26,(size_t)(pfStack_2548->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          pbVar33 = (pfVar24->field_6).seqtree;
          pfVar26 = (fdb_kvs_handle *)(pfVar8->field_6).seqtree;
          pfStack_2560 = (fdb_kvs_handle *)0x10ef96;
          iVar4 = bcmp(pbVar33,pfVar26,(size_t)(pfVar24->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010ef9e;
          pfStack_2560 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar12 = pfVar24;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar24 = pfVar12;
        pfStack_2560 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_2560 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar12 = pfVar24;
LAB_0010f073:
      pfStack_2560 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_2560 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_2560 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_2560 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_2588 = ppfVar16;
  pfStack_2580 = pfVar26;
  pfStack_2578 = (fdb_kvs_handle *)doc._M_i;
  pfStack_2570 = pfVar12;
  pbStack_2568 = pbVar33;
  pfStack_2560 = pfVar8;
  gettimeofday(&tStack_2a38,(__timezone_ptr_t)0x0);
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_2a28;
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_2680.buffercache_size = 0x1000000;
  fStack_2680.wal_threshold = 0x400;
  fStack_2680.flags = 1;
  fStack_2680.compaction_threshold = '\0';
  ppfVar34 = &pfStack_2aa0;
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar34,"./compact_test1",&fStack_2680);
  ptr_handle = (list *)(auStack_2ab0 + 8);
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_2aa0,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar12
            );
  pfStack_2ac8 = (fdb_kvs_handle *)0x10f133;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_2ab0._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_2810,"key%d",uVar14 & 0xffffffff);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_2a28 + 0x118,"meta%d",uVar14 & 0xffffffff);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_2a28 + 0x18,"body%d",uVar14 & 0xffffffff);
      ppfVar34 = (fdb_doc **)((long)apfStack_2a90 + (long)pfVar26);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_2810);
      pfVar8 = (fdb_kvs_handle *)(auStack_2a28 + 0x118);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f1ae;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar8);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f1be;
      sVar5 = strlen(auStack_2a28 + 0x18);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar34,acStack_2810,doc._M_i,pfVar8,(size_t)pfVar12,auStack_2a28 + 0x18,sVar5
                    );
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_2ab0._8_8_,apfStack_2a90[uVar14]);
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 10);
    pfStack_2ac8 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_2aa0,'\x01');
    pfStack_2ac8 = (fdb_kvs_handle *)0x10f226;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2ab0._8_8_,&pfStack_2a98,10);
    ptr_handle = (list *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_2ac8 = (fdb_kvs_handle *)0x10f23f;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_2aa0,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_2ab0,apfStack_2a90[(long)pfVar12]->key,
                       apfStack_2a90[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f282;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_2ab0._8_8_,(fdb_doc *)auStack_2ab0._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_2ac8 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_2ab0._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
      } while (pfVar12 != (fdb_kvs_handle *)0xa);
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f2b1;
      iVar4 = stat("./compact_test1",&sStack_2710);
      if (iVar4 == 0) {
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar12 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_2ab0,apfStack_2a90[(long)pfVar12]->key,
                       apfStack_2a90[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f2f5;
        fVar3 = fdb_get(pfStack_2a98,(fdb_doc *)auStack_2ab0._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_2ac8 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_2ab0._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
        if (pfVar12 == (fdb_kvs_handle *)0xa) {
          pfStack_2ac8 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_2aa0);
          pfStack_2ac8 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar25 = 0;
          do {
            pfStack_2ac8 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_2a90[lVar25]);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 10);
          pfStack_2ac8 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_2ac8 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar20,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_2ab0;
      pfStack_2ac8 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_2ac8 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_2ac8 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_2ac8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_3270 = (fdb_kvs_handle *)0x10f3b5;
  fStack_2cd8.bub_ctx.entries = ptr_handle;
  fStack_2cd8.bub_ctx.num_entries = (uint64_t)pfVar26;
  fStack_2cd8.bub_ctx.space_used = doc._M_i;
  fStack_2cd8.bub_ctx.handle = pfVar12;
  ppfStack_2ad0 = ppfVar34;
  pfStack_2ac8 = pfVar8;
  gettimeofday(&tStack_31d8,(__timezone_ptr_t)0x0);
  pfStack_3270 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_3270 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3270 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_3220;
  pfStack_3270 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_30c8._256_8_ = 0x1000000;
  auStack_30c8._264_8_ = 0x400;
  auStack_30c8._284_4_ = 1;
  auStack_30c8[0x127] = 0;
  pfVar12 = (fdb_kvs_handle *)(auStack_3248 + 0x18);
  pfStack_3270 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_30c8 + 0xf8));
  ppfVar16 = (fdb_kvs_handle **)(auStack_3248 + 8);
  pfStack_3270 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_3248._24_8_,ppfVar16,(char *)0x0,kvs_config_00);
  pfStack_3270 = (fdb_kvs_handle *)0x10f440;
  pfVar24 = (fdb_kvs_handle *)auStack_3248._8_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3248._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_2dd8,"key%d",uVar14 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_30c8 + 0x1f0,"meta%d",uVar14 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_31c8,"body%d",uVar14 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(auStack_30c8 + (long)pfVar26);
      pfStack_3270 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_2dd8);
      pfVar8 = (fdb_kvs_handle *)(auStack_30c8 + 0x1f0);
      pfStack_3270 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f4ce;
      sVar5 = strlen(acStack_31c8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2dd8,doc._M_i,pfVar8,(size_t)kvs_config_00,
                     acStack_31c8,sVar5);
      pfStack_3270 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_3248._8_8_,*(fdb_doc **)(auStack_30c8 + uVar14 * 8));
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 0x1e);
    pfStack_3270 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_3248._24_8_,'\0');
    pfStack_3270 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_3248 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_30c8 + 0xf8));
    ppfVar16 = (fdb_kvs_handle **)auStack_3258;
    pfStack_3270 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._16_8_,ppfVar16,(char *)0x0,&fStack_3220);
    pfStack_3270 = (fdb_kvs_handle *)0x10f56b;
    pfVar24 = (fdb_kvs_handle *)auStack_3258._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3258._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar26 = (fdb_kvs_handle *)0x0;
    uVar14 = 0;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_2dd8,"k2ey%d",uVar14 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_30c8 + 0x1f0,"m2eta%d",uVar14 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_31c8,"b2ody%d",uVar14 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(&fStack_2cd8.kvs_config.create_if_missing + (long)pfVar26);
      pfStack_3270 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_2dd8);
      pfVar8 = (fdb_kvs_handle *)(auStack_30c8 + 0x1f0);
      pfStack_3270 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f5f9;
      sVar5 = strlen(acStack_31c8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2dd8,doc._M_i,pfVar8,(size_t)kvs_config_00,
                     acStack_31c8,sVar5);
      pfStack_3270 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_3258._0_8_,
              *(fdb_doc **)(&fStack_2cd8.kvs_config.create_if_missing + uVar14 * 8));
      uVar14 = uVar14 + 1;
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 8);
    } while (uVar14 != 0x3c);
    pfStack_3270 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_3248._16_8_,'\0');
    pfStack_3270 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3258._0_8_,&fStack_3208);
    if ((filemgr *)fStack_3208.last_seqnum != (filemgr *)0x3c) {
      pfStack_3270 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_3270 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3258._0_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_3248._16_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f68c;
    pfVar24 = (fdb_kvs_handle *)auStack_3248._24_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_3248._24_8_,(char *)0x0);
    ppfVar16 = (fdb_kvs_handle **)0x3c;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_3248 + 8);
    pfStack_3270 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3248._8_8_);
    pfVar12 = (fdb_kvs_handle *)(auStack_3248 + 0x18);
    pfStack_3270 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_3248._24_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_30c8 + 0xf8));
    pfStack_3270 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_3220);
    pfStack_3270 = (fdb_kvs_handle *)0x10f6ed;
    pfVar24 = (fdb_kvs_handle *)auStack_3248._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3248._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar16 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_3258 + 8);
    pfVar12 = (fdb_kvs_handle *)auStack_3248;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_30c8 + (long)ppfVar16))[4],
                     **(size_t **)(auStack_30c8 + (long)ppfVar16),(void *)0x0,0,(void *)0x0,0);
      pfStack_3270 = (fdb_kvs_handle *)0x10f737;
      pfVar24 = (fdb_kvs_handle *)auStack_3248._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_3248._8_8_,(fdb_doc *)auStack_3258._8_8_);
      pfVar19 = (fdb_kvs_handle *)auStack_3258._8_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_30c8 + (long)ppfVar16);
      pfVar26 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_3270 = (fdb_kvs_handle *)0x10f765;
      iVar4 = bcmp(*(btree **)(auStack_3258._8_8_ + 0x38),pfVar26->staletree,
                   (size_t)((fdb_kvs_config *)auStack_3258._8_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar19 = pfStack_3228;
        pfVar26 = (fdb_kvs_handle *)auStack_3248._0_8_;
      }
      pfStack_3270 = (fdb_kvs_handle *)0x10f77b;
      iVar4 = bcmp((pfVar19->field_6).seqtree,(pfVar26->field_6).seqtree,
                   (size_t)(pfVar19->kvs_config).custom_cmp_param);
      pfVar8 = pfVar19;
      if (iVar4 != 0) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar8 = (fdb_kvs_handle *)auStack_3248._0_8_;
      }
      pfStack_3270 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar8);
      ppfVar16 = ppfVar16 + 1;
    } while (ppfVar16 != (fdb_kvs_handle **)0xf0);
    pfStack_3270 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_3248 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_30c8 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_3258;
    pfStack_3270 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_3220);
    pfStack_3270 = (fdb_kvs_handle *)0x10f817;
    pfVar24 = (fdb_kvs_handle *)auStack_3258._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3258._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_3270 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_3258._0_8_,&fStack_3208);
      if ((filemgr *)fStack_3208.last_seqnum != (filemgr *)0x3c) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar8 = (fdb_kvs_handle *)0x0;
      ppfVar16 = (fdb_kvs_handle **)(auStack_3258 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_3248;
      while( true ) {
        psVar2 = *(size_t **)
                  (&fStack_2cd8.kvs_config.create_if_missing +
                  (long)&(pfVar8->kvs_config).create_if_missing);
        pfStack_3270 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar16,(void *)psVar2[4],*psVar2,(void *)0x0,0,(void *)0x0,0);
        pfStack_3270 = (fdb_kvs_handle *)0x10f884;
        pfVar24 = (fdb_kvs_handle *)auStack_3258._0_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_3258._0_8_,(fdb_doc *)auStack_3258._8_8_);
        pfVar19 = (fdb_kvs_handle *)auStack_3258._8_8_;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfVar26 = (fdb_kvs_handle *)
                  (&fStack_2cd8.kvs_config.create_if_missing +
                  (long)&(pfVar8->kvs_config).create_if_missing);
        pfVar12 = *(fdb_kvs_handle **)&pfVar26->kvs_config;
        pfStack_3270 = (fdb_kvs_handle *)0x10f8b1;
        iVar4 = bcmp(*(btree **)(auStack_3258._8_8_ + 0x38),pfVar12->staletree,
                     (size_t)((fdb_kvs_config *)auStack_3258._8_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_3270 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar19 = pfStack_3228;
          pfVar12 = (fdb_kvs_handle *)auStack_3248._0_8_;
        }
        pfStack_3270 = (fdb_kvs_handle *)0x10f8c6;
        iVar4 = bcmp((pfVar19->field_6).seqtree,(pfVar12->field_6).seqtree,
                     (size_t)(pfVar19->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar19;
        if (iVar4 != 0) {
          pfStack_3270 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_3248._0_8_;
        }
        pfStack_3270 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).custom_cmp;
        if (pfVar8 == (fdb_kvs_handle *)0x1e0) {
          lVar25 = 0;
          do {
            pfStack_3270 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_30c8 + lVar25 * 8));
            pfStack_3270 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_2cd8.kvs_config.create_if_missing + lVar25 * 8));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 0x1e);
          lVar25 = 0;
          do {
            pfStack_3270 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_2cd8.config.encryption_key.bytes + lVar25 * 8 + -0x14)
                        );
            lVar25 = lVar25 + 1;
          } while (lVar25 != 0x1e);
          pfStack_3270 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3248._8_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_3248._24_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3258._0_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_3248._16_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_3270 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_3270 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar20,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_3270 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_3270 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_3270 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_3270 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_3270 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_3270 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_3298 = ppfVar16;
  pfStack_3290 = pfVar26;
  pfStack_3288 = (fdb_kvs_handle *)doc._M_i;
  pfStack_3280 = kvs_config_00;
  pfStack_3278 = pfVar12;
  pfStack_3270 = pfVar8;
  gettimeofday(&tStack_39c8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_39b8.buffercache_size = 0;
  fStack_39b8.wal_threshold = 0x400;
  fStack_39b8.compaction_threshold = '\0';
  if (pfVar24 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var27._M_i = (__int_type_conflict)&pfStack_3a30;
    fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_39b8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      _Var27._M_i = (__int_type_conflict)pfStack_3a30;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3a30,&pfStack_3a28,&fStack_3a10);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar25 = 0;
      uVar14 = 0;
      do {
        __s = &afStack_37c0[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar14 & 0xffffffff);
        sprintf((char *)afStack_37c0,"meta%d",uVar14 & 0xffffffff);
        sprintf(acStack_38c0,"body%d",uVar14 & 0xffffffff);
        doc._M_i = strlen((char *)__s);
        pfVar8 = afStack_37c0;
        sVar5 = strlen((char *)pfVar8);
        sVar6 = strlen(acStack_38c0);
        fdb_doc_create((fdb_doc **)((long)&afStack_37c0[0].bub_ctx.handle + lVar25),
                       &afStack_37c0[0].config.encryption_key,doc._M_i,pfVar8,sVar5,acStack_38c0,
                       sVar6);
        fdb_set(pfStack_3a28,(fdb_doc *)(&afStack_37c0[0].bub_ctx.handle)[uVar14]);
        uVar14 = uVar14 + 1;
        lVar25 = lVar25 + 8;
      } while (uVar14 != 100);
      fdb_commit((fdb_file_handle *)pfStack_3a30,'\0');
      fdb_get_kvs_info(pfStack_3a28,&fStack_39f8);
      if ((filemgr *)fStack_39f8.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar25 = 0;
      pfVar12 = (fdb_kvs_handle *)&plStack_3a20;
      do {
        fdb_del(pfStack_3a28,(fdb_doc *)(&afStack_37c0[0].bub_ctx.handle)[lVar25]);
        if (lVar25 == 0x32) {
          pthread_create((pthread_t *)pfVar12,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_3a30);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 100);
      pthread_join((pthread_t)plStack_3a20,&pvStack_3a18);
      fdb_commit((fdb_file_handle *)pfStack_3a30,'\x01');
      fdb_get_kvs_info(pfStack_3a28,&fStack_39f8);
      if ((filemgr *)fStack_39f8.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_3a28);
      _Var27._M_i = (__int_type_conflict)&pfStack_3a30;
      fdb_close((fdb_file_handle *)pfStack_3a30);
      fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_39b8);
      pfVar26 = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var27._M_i = (__int_type_conflict)pfStack_3a30;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3a30,&pfStack_3a28,&fStack_3a10);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_3a28,&fStack_39f8);
        if ((filemgr *)fStack_39f8.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar25 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_37c0[0].bub_ctx.handle)[lVar25]);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 100);
        fdb_kvs_close(pfStack_3a28);
        fdb_close((fdb_file_handle *)pfStack_3a30);
        fdb_shutdown();
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar20,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var27._M_i = (__int_type_conflict)&pfStack_3a30;
    fVar3 = fdb_open((fdb_file_handle **)_Var27._M_i,"./compact_test1",&fStack_39b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var27._M_i = (__int_type_conflict)pfStack_3a30;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_3a30,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_3a30);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_177f0 = (fdb_kvs_handle *)0x10fd83;
  auStack_177b8._8_8_ = _Var27._M_i;
  gettimeofday(&tStack_17650,(__timezone_ptr_t)0x0);
  pfStack_177f0 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_177f0 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar20 = auStack_17758;
  pfStack_177f0 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_177f0 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_17758._8_8_ = 0;
  aStack_17748.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_17734 = 1;
  uStack_1772a = 0x1e01;
  pfStack_17720 = (filemgr *)0x1;
  aStack_176e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar31 = auStack_177e0;
  pfStack_177f0 = (fdb_kvs_handle *)0x10fde7;
  fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test",(fdb_config *)pcVar20);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    aStack_176e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_177f0 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_177e0,"compact_test",(fdb_config *)auStack_17758);
    pcVar20 = auStack_177d8;
    pfStack_177f0 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_177e0,(fdb_kvs_handle **)pcVar20,&fStack_177a8);
    pfStack_177f0 = (fdb_kvs_handle *)0x10fe3f;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177d8,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_177f0 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar14 = 0;
    do {
      pfStack_177f0 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_17640 + 0x48,"key%04d",uVar14 & 0xffffffff);
      pfStack_177f0 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_173f8,"meta%04d",uVar14 & 0xffffffff);
      pfStack_177f0 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_174f8,"body%04d",uVar14 & 0xffffffff);
      pfVar26 = (fdb_kvs_handle *)(&afStack_172f8[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_177f0 = (fdb_kvs_handle *)0x10feba;
      sVar5 = strlen(auStack_17640 + 0x48);
      pfVar8 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_177f0 = (fdb_kvs_handle *)0x10fece;
      sVar5 = strlen(acStack_173f8);
      pfVar12 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_177f0 = (fdb_kvs_handle *)0x10fedf;
      sVar5 = strlen(acStack_174f8);
      pfStack_177f0 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar26,auStack_17640 + 0x48,(size_t)pfVar8,acStack_173f8,
                     (size_t)pfVar12,acStack_174f8,sVar5 + 1);
      pfStack_177f0 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_177d8,
              *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + uVar14 * 8));
      uVar14 = uVar14 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar14 != 10000);
    pcVar20 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_177e0,'\0');
    pfStack_177f0 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_177e0);
    pfStack_177f0 = (fdb_kvs_handle *)0x10ff5b;
    pcVar31 = pcVar20;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test",(fdb_config *)auStack_17758);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_177f0 = (fdb_kvs_handle *)0x10ff77;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e0,(fdb_kvs_handle **)auStack_177d8,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_177f0 = (fdb_kvs_handle *)0x10ff97;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177d8,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar20 = auStack_17640;
    pfStack_177f0 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_177e0,(fdb_file_info *)pcVar20);
    pfStack_177f0 = (fdb_kvs_handle *)0x10ffc3;
    iVar4 = strcmp((char *)auStack_17640._0_8_,"compact_test");
    if (iVar4 != 0) {
      pfStack_177f0 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_17640 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_177c8;
    pfVar26 = (fdb_kvs_handle *)0x0;
    _Var27._M_i = doc._M_i;
    do {
      pfStack_177f0 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_177f0 = (fdb_kvs_handle *)0x110000;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_177f0 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_177f0 = (fdb_kvs_handle *)0x11002e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177d8,(fdb_doc *)auStack_177c8._0_8_);
      doc._M_i = auStack_177c8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_177f0 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_177c8._0_8_ + 0x40))->
               seqtree;
      pcVar20 = *(char **)(*(long *)(&afStack_172f8[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_177f0 = (fdb_kvs_handle *)0x11005a;
      iVar4 = bcmp(pfVar8,pcVar20,(size_t)*(void **)(auStack_177c8._0_8_ + 0x10));
      _Var27._M_i = doc._M_i;
      if (iVar4 != 0) {
        pfStack_177f0 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_177f0 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pfStack_177f0 = (fdb_kvs_handle *)0x11008e;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_177d8,(fdb_kvs_handle **)&aStack_17790,10000
                             );
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_177f0 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_17790.super___atomic_base<unsigned_long>._M_i);
    pcVar20 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_177e0);
    pfStack_177f0 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_177f0 = (fdb_kvs_handle *)0x1100d0;
    pcVar31 = pcVar20;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_177f0 = (fdb_kvs_handle *)0x1100ec;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e0,(fdb_kvs_handle **)auStack_177d8,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_177f0 = (fdb_kvs_handle *)0x11010c;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177d8,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_17640 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_177c8;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_177f0 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_177f0 = (fdb_kvs_handle *)0x110140;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_177f0 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_177f0 = (fdb_kvs_handle *)0x11016e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177d8,(fdb_doc *)auStack_177c8._0_8_);
      _Var27._M_i = auStack_177c8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_177c8._0_8_ + 0x40))->
               seqtree;
      pcVar20 = *(char **)(*(long *)(&afStack_172f8[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_177f0 = (fdb_kvs_handle *)0x11019a;
      iVar4 = bcmp(pfVar8,pcVar20,(size_t)*(void **)(auStack_177c8._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108a3;
      pfStack_177f0 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var27._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
      doc._M_i = _Var27._M_i;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pcVar20 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_177e0);
    pfStack_177f0 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_177f0 = (fdb_kvs_handle *)0x1101ea;
    pcVar31 = pcVar20;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110206;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e0,(fdb_kvs_handle **)auStack_177d8,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_177f0 = (fdb_kvs_handle *)0x110226;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177d8,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_17640 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_177c8;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_177f0 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar26 & 0xffffffff);
      pfStack_177f0 = (fdb_kvs_handle *)0x11025a;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_177f0 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_177f0 = (fdb_kvs_handle *)0x110288;
      pcVar31 = (char *)auStack_177d8;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177d8,(fdb_doc *)auStack_177c8._0_8_);
      _Var27._M_i = auStack_177c8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar8 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_177c8._0_8_ + 0x40))->
               seqtree;
      pcVar20 = *(char **)(*(long *)(&afStack_172f8[0].kvs_config.create_if_missing +
                                    (long)pfVar26 * 8) + 0x40);
      pfStack_177f0 = (fdb_kvs_handle *)0x1102b4;
      iVar4 = bcmp(pfVar8,pcVar20,(size_t)*(void **)(auStack_177c8._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108b3;
      pfStack_177f0 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var27._M_i);
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
      doc._M_i = _Var27._M_i;
    } while (pfVar26 != (fdb_kvs_handle *)0x2710);
    pfStack_177f0 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_177e0);
    pcVar31 = auStack_177b8;
    pfStack_177f0 = (fdb_kvs_handle *)0x1102f7;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_less",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_177f0 = (fdb_kvs_handle *)0x110313;
    pcVar31 = (char *)auStack_177b8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177b8._0_8_,
                       (fdb_kvs_handle **)&aStack_17778.seqtree,&fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_1772a = uStack_1772a & 0xff;
    pcVar31 = auStack_177c8 + 8;
    pfStack_177f0 = (fdb_kvs_handle *)0x110338;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_177f0 = (fdb_kvs_handle *)0x110354;
    pcVar31 = (char *)auStack_177c8._8_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177c8._8_8_,(fdb_kvs_handle **)&_Stack_17780,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_1772a = uStack_1772a & 0xff00;
    pcVar31 = auStack_177d0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110379;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_177f0 = (fdb_kvs_handle *)0x110395;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177d0,(fdb_kvs_handle **)&aStack_17788.seqtree,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_1772a = 0x1e01;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x1103bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_177f0 = (fdb_kvs_handle *)0x1103d8;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e0,(fdb_kvs_handle **)auStack_177d8,
                       &fStack_177a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_177f0 = (fdb_kvs_handle *)0x1103f8;
    pcVar31 = (char *)auStack_177d8;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177d8,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var27._M_i = 0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar20 = auStack_17660;
    pfStack_177f0 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar20,(__timezone_ptr_t)0x0);
    tVar36.tv_usec = auStack_17660._8_8_;
    tVar36.tv_sec = auStack_17660._0_8_;
    pfVar26 = (fdb_kvs_handle *)auStack_17768;
    while( true ) {
      pfStack_177f0 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_177d8,
              *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_177f0 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_177e0,'\0');
      if ((ushort)((ushort)((short)_Var27._M_i * 0x5c29) >> 2 | (short)_Var27._M_i * 0x4000) < 0x290
         ) {
        pfStack_177f0 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_17778.seqtree,
                *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + _Var27._M_i * 8));
        pfStack_177f0 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_177b8._0_8_,'\0');
      }
      pfStack_177f0 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_17780._M_i,
              *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_177f0 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_177c8._8_8_,'\0');
      pfStack_177f0 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_17788.seqtree,
              *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + _Var27._M_i * 8));
      pfStack_177f0 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_177d0,'\0');
      pfStack_177f0 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar26,(__timezone_ptr_t)0x0);
      pfStack_177f0 = (fdb_kvs_handle *)0x1104e9;
      tVar35 = _utime_gap(tVar36,(timeval)auStack_17768);
      if ((ulong)auStack_177b8._8_8_ <= (fdb_kvs_handle *)tVar35.tv_sec) break;
      _Var27._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var27._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var27._M_i == (undefined1 *)0x2710) {
        _Var27._M_i = 0;
      }
    }
    pfStack_177f0 = (fdb_kvs_handle *)0x110517;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_177e0,0x3c);
    ptr_fhandle = (filemgr *)auStack_17660._0_8_;
    pfVar12 = (fdb_kvs_handle *)auStack_17660._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_177f0 = (fdb_kvs_handle *)0x11052e;
    pcVar31 = (char *)auStack_177e0;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_177e0,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_177f0 = (fdb_kvs_handle *)0x110542;
    pcVar31 = (char *)auStack_177c8._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_177c8._8_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_177f0 = (fdb_kvs_handle *)0x11055b;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_177d0,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_1772a = uStack_1772a & 0xff00;
    pcVar31 = auStack_17770;
    pfStack_177f0 = (fdb_kvs_handle *)0x110580;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_177f0 = (fdb_kvs_handle *)0x11059c;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_177d0,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_177f0 = (fdb_kvs_handle *)0x1105af;
    fVar3 = fdb_close((fdb_file_handle *)auStack_17770);
    pcVar31 = (char *)auStack_17770;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_177f0 = (fdb_kvs_handle *)0x1105cb;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_177d0,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_177f0 = (fdb_kvs_handle *)0x1105e7;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_177d0,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_177f0 = (fdb_kvs_handle *)0x1105f9;
    pcVar31 = (char *)auStack_177d0;
    fVar3 = fdb_close((fdb_file_handle *)auStack_177d0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_1772a = CONCAT11(uStack_1772a._1_1_,1);
    pcVar31 = auStack_177d0;
    pfStack_177f0 = (fdb_kvs_handle *)0x11061e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_177f0 = (fdb_kvs_handle *)0x110634;
    pcVar31 = (char *)auStack_177c8._8_8_;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_177c8._8_8_,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_177f0 = (fdb_kvs_handle *)0x110646;
    pcVar31 = (char *)auStack_177c8._8_8_;
    fVar3 = fdb_close((fdb_file_handle *)auStack_177c8._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_1772a = uStack_1772a & 0xff00;
    pcVar31 = auStack_177c8 + 8;
    pfStack_177f0 = (fdb_kvs_handle *)0x11066b;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar20 = "compact_test_non.manual";
    pfStack_177f0 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_177c8._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_177e0);
    pfStack_177f0 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_177b8._0_8_);
    pfStack_177f0 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_177d0);
    uStack_1772a = CONCAT11(uStack_1772a._1_1_,1);
    pfStack_177f0 = (fdb_kvs_handle *)0x1106bf;
    pcVar31 = (char *)ptr_fhandle;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar31 = "compact_test_non.manual";
    pfStack_177f0 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_1772a = uStack_1772a & 0xff00;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110702;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar31 = "compact_test_manual_compacted";
    pfStack_177f0 = (fdb_kvs_handle *)0x11071f;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_1772a = CONCAT11(uStack_1772a._1_1_,1);
    pcVar31 = "compact_test_manual_compacted";
    pfStack_177f0 = (fdb_kvs_handle *)0x110740;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_1772a = uStack_1772a & 0xff00;
    pcVar31 = "compact_test_non.manual";
    pfStack_177f0 = (fdb_kvs_handle *)0x110760;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_177f0 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_177c8._8_8_);
    pfStack_177f0 = (fdb_kvs_handle *)0x110778;
    fVar3 = fdb_shutdown();
    pcVar31 = (char *)auStack_177c8._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar31 = "compact_test_non.manual";
    pfStack_177f0 = (fdb_kvs_handle *)0x110794;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_17734 = 2;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x1107bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x1107de;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110800;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar31 = auStack_177e0;
    pfStack_177f0 = (fdb_kvs_handle *)0x110822;
    fVar3 = fdb_open((fdb_file_handle **)pcVar31,"compact_test_non.manual",
                     (fdb_config *)auStack_17758);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar25 = 0;
      do {
        pfStack_177f0 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + lVar25 * 8));
        lVar25 = lVar25 + 1;
      } while (lVar25 != 10000);
      pfStack_177f0 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_177f0 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_177f0 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar20,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var27._M_i = doc._M_i;
LAB_001108eb:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_177f0 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_177f0 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_177f0 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_177f0 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_177f0 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_177f0 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_177f0 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_177f0 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_177f0 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_177f0 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_177f0 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_177f0 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_177f0 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_177f0 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_177f0 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_177f0 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_177f0 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_177f0 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_177f0 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_177f0 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_177f0 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_177f0 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_177f0 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_177f0 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_177f0 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_177f0 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_177f0 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_177f0 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_177f0 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_177f0 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_177f0 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_177f0 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_177f0 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_177f0 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_177f0 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_177f0 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_17988 = (fdb_kvs_handle *)0x1109ce;
  pfStack_17818 = (filemgr *)pcVar20;
  pfStack_17810 = pfVar26;
  pfStack_17808 = (fdb_kvs_handle *)_Var27._M_i;
  pfStack_17800 = ptr_fhandle;
  pfStack_177f8 = pfVar12;
  pfStack_177f0 = pfVar8;
  gettimeofday(&tStack_17938,(__timezone_ptr_t)0x0);
  pfStack_17988 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_17988 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_17988 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_178e2 = 1;
  uStack_178d8._0_2_ = 1;
  uStack_178d8._2_2_ = 0;
  uStack_178d8._4_4_ = 0;
  pfStack_17988 = (fdb_kvs_handle *)0x110a0d;
  fVar3 = fdb_open(&pfStack_17978,"compact_test",(fdb_config *)(auStack_17928 + 0x18));
  pfVar28 = (fdb_config *)(auStack_17928 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar28 = (fdb_config *)auStack_17928;
    pfStack_17988 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_17988 = (fdb_kvs_handle *)0x110a34;
    fVar3 = fdb_kvs_open_default(pfStack_17978,&pfStack_17970,(fdb_kvs_config *)pfVar28);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_17988 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_17948,(__timezone_ptr_t)0x0);
    pfStack_17988 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar31 & 0xffffffff);
    tVar35.tv_usec = tStack_17948.tv_usec;
    tVar35.tv_sec = tStack_17948.tv_sec;
    _Var27._M_i = (long)&atStack_17968[1].tv_sec + 1;
    pfVar8 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar8;
      pfStack_17988 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var27._M_i,"%d",pfVar8);
      pfVar26 = pfStack_17970;
      pfStack_17988 = (fdb_kvs_handle *)0x110a89;
      sVar5 = strlen((char *)_Var27._M_i);
      pfStack_17988 = (fdb_kvs_handle *)0x110aa4;
      fVar3 = fdb_set_kv(pfVar26,(void *)_Var27._M_i,sVar5,"value",5);
      pfVar28 = (fdb_config *)tStack_17948.tv_sec;
      pfVar12 = (fdb_kvs_handle *)tStack_17948.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_17988 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_17988 = (fdb_kvs_handle *)0x110ab8;
      fVar3 = fdb_commit(pfStack_17978,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_17988 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_17988 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_17968,(__timezone_ptr_t)0x0);
      pfStack_17988 = (fdb_kvs_handle *)0x110ae1;
      tVar36 = _utime_gap(tVar35,atStack_17968[0]);
    } while (((filemgr *)tVar36.tv_sec < pcVar31) &&
            (pfVar8 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_17988 = (fdb_kvs_handle *)0x110b01;
    fVar3 = fdb_close(pfStack_17978);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_17988 = (fdb_kvs_handle *)0x110b0a;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_17988 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_17988 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar20,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_17988 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_17988 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_17988 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_17988 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_179b0 = (filemgr *)pcVar31;
  pfStack_179a8 = pfVar26;
  pfStack_179a0 = (fdb_kvs_handle *)_Var27._M_i;
  pfStack_17998 = pfVar28;
  pfStack_17990 = pfVar12;
  pfStack_17988 = pfVar8;
  gettimeofday(&tStack_17cb8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17d28._32_8_ = (btree *)0x0;
  auStack_17d28._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_17aa8.wal_threshold = 0x1000;
  fStack_17aa8.compaction_mode = '\x01';
  fStack_17aa8.compaction_threshold = '\n';
  fStack_17aa8.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_17d48;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_17aa8,1,
                              (char **)(auStack_17d28 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17d28 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17d28._16_8_ = afStack_17ca8[0].doc_count;
    auStack_17d28._0_8_ = afStack_17ca8[0].filename;
    auStack_17d28._8_8_ = afStack_17ca8[0].new_filename;
    info = (fdb_file_info *)auStack_17d40;
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17d48,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_17d28);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_17d30;
    kvs_config_01 = (fdb_file_info *)auStack_17d28;
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17d48,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar14 = 0;
    do {
      sprintf((char *)afStack_17ca8,"key%06d",uVar14);
      sprintf((char *)afStack_17ba8,"body%06d",uVar14);
      pfVar8 = (fdb_kvs_handle *)auStack_17d40._0_8_;
      sVar5 = strlen((char *)afStack_17ca8);
      sVar6 = strlen((char *)afStack_17ba8);
      kvs_config_01 = afStack_17ba8;
      info = afStack_17ca8;
      fVar3 = fdb_set_kv(pfVar8,afStack_17ca8,sVar5,afStack_17ba8,sVar6);
      handle = auStack_17d30;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar5 = strlen((char *)afStack_17ca8);
      sVar6 = strlen((char *)afStack_17ba8);
      kvs_config_01 = afStack_17ba8;
      info = afStack_17ca8;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_17ca8,sVar5,afStack_17ba8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar18 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar18;
    } while (uVar18 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_17d28;
    auStack_17d28._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_17d40 + 8);
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17d48,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_17ca8;
    sprintf((char *)info,"key%06d",0);
    kvs_config_01 = afStack_17ba8;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar5 = strlen((char *)info);
    sVar6 = strlen((char *)kvs_config_01);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17d40._8_8_,info,sVar5,kvs_config_01,sVar6);
    pfVar8 = (fdb_kvs_handle *)auStack_17d40._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17d48,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar14 = 0;
    uVar29 = 0;
    do {
      sprintf((char *)afStack_17ca8,"key%06d",uVar29);
      sprintf((char *)afStack_17ba8,"body%06d",uVar29);
      pfVar8 = (fdb_kvs_handle *)auStack_17d40._0_8_;
      sVar5 = strlen((char *)afStack_17ca8);
      sVar6 = strlen((char *)afStack_17ba8);
      kvs_config_01 = afStack_17ba8;
      info = afStack_17ca8;
      fVar3 = fdb_set_kv(pfVar8,afStack_17ca8,sVar5,afStack_17ba8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_17d28 + 0x28);
      pfVar8 = pfStack_17d48;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d48,info);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar14 < uStack_17cd8) {
        uVar14 = uStack_17cd8;
      }
      uVar18 = (int)uVar29 + 1;
      uVar29 = (ulong)uVar18;
    } while (uVar18 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17d48,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_17d28 + 0x28);
    pfVar8 = pfStack_17d48;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d48,info);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar14 < uStack_17cd8) {
      uVar14 = uStack_17cd8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar14);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_17d28 + 0x28);
      pfVar8 = pfStack_17d48;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d48,
                                (fdb_file_info *)(auStack_17d28 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar14 <= uStack_17cd8);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17d48);
    pfVar8 = pfStack_17d48;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar8 = pfStack_17d48;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar20,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_01) {
    memcmp(pfVar8,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_01) {
    kvs_config_01 = info;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config_01);
  return;
LAB_0010eb2a:
  pfStack_2078 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar32 = pcVar31;
LAB_0010eb2f:
  pfStack_2078 = (fdb_kvs_handle *)0x10eb34;
  compact_upto_test();
LAB_0010eb34:
  pfStack_2078 = (fdb_kvs_handle *)0x10eb39;
  compact_upto_test();
LAB_0010eb39:
  pfStack_2078 = (fdb_kvs_handle *)0x10eb3e;
  compact_upto_test();
LAB_0010eb3e:
  pfStack_2078 = (fdb_kvs_handle *)0x10eb43;
  compact_upto_test();
  goto LAB_0010eb43;
LAB_001108a3:
  pfStack_177f0 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var27._M_i;
LAB_001108ae:
  _Var27._M_i = doc._M_i;
  pfStack_177f0 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_177f0 = (fdb_kvs_handle *)0x1108be;
  pcVar31 = pcVar20;
  compaction_daemon_test();
  doc._M_i = _Var27._M_i;
LAB_001108be:
  pfVar12 = (fdb_kvs_handle *)auStack_177c8;
  ptr_fhandle = (filemgr *)(auStack_17640 + 0x48);
  pfStack_177f0 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
}

Assistant:

void compact_reopen_named_kvs()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int nkvdocs;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_kvs_info kvs_info;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_named_kvs");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // compact
    fdb_compact(dbfile, NULL);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen named kvs");
}